

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O0

string * __thiscall
cfd::api::TransactionApi::CreateSignatureHash
          (TransactionApi *this,string *tx_hex,TxInReference *txin,Script *redeem_script,
          Amount *amount,HashType hash_type,SigHashType *sighash_type)

{
  string *in_RCX;
  TransactionApi *in_RDX;
  string *in_RDI;
  Script *in_R8;
  ByteData *in_R9;
  HashType unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  Amount *in_stack_ffffffffffffffc8;
  
  core::Script::GetData((ByteData *)&stack0xffffffffffffffb8,in_R8);
  CreateSignatureHash(in_RDX,in_RCX,(TxInReference *)in_R8,in_R9,in_stack_ffffffffffffffc8,
                      unaff_retaddr,(SigHashType *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  core::ByteData::~ByteData((ByteData *)0x53f6db);
  return in_RDI;
}

Assistant:

std::string TransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const TxInReference& txin,
    const Script& redeem_script, const Amount& amount, HashType hash_type,
    const SigHashType& sighash_type) const {
  return CreateSignatureHash(
      tx_hex, txin, redeem_script.GetData(), amount, hash_type, sighash_type);
}